

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.cpp
# Opt level: O2

void ReplaceObject(void)

{
  RecyclerTestObject *value;
  Location LVar1;
  Location local_20;
  
  value = CreateNewObject();
  LVar1 = GetRandomLocation();
  local_20.location = LVar1.location;
  local_20.type = LVar1.type;
  Location::Set(&local_20,value);
  return;
}

Assistant:

void ReplaceObject()
{
    // Create a new object
    RecyclerTestObject * object = CreateNewObject();
    
    // Walk to a random location in the current object graph
    Location location = GetRandomLocation();

    // Set the new object there unconditionally
    location.Set(object);
}